

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O2

string * set_xterm256_foreground_abi_cxx11_(string *__return_storage_ptr__,int r,int g,int b)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ostringstream oss;
  
  iVar1 = (int)((double)b * 0.114 + (double)r * 0.299 + (double)g * 0.587 + 0.5);
  if (iVar1 < 0xef) {
    iVar1 = (iVar1 + -3) / 10;
  }
  else {
    iVar1 = 0x17;
  }
  if (r < 0x73) {
    uVar5 = 1;
  }
  else {
    uVar5 = (ulong)(r - 0x23) / 0x28;
  }
  iVar6 = iVar1 * 10 + 8;
  uVar2 = 0;
  if (0x2f < g) {
    if ((uint)g < 0x73) {
      uVar2 = 1;
    }
    else {
      uVar2 = (g - 0x23U) / 0x28;
    }
  }
  uVar4 = (ulong)(2 - ((uint)b < 0x73));
  if (b < 0x30) {
    uVar4 = 0;
  }
  if ((uint)((iVar6 - b) * (iVar6 - b) + (iVar6 - g) * (iVar6 - g) + (iVar6 - r) * (iVar6 - r)) <
      ((uint)(byte)(&DAT_001d70d0)[uVar4] - b) * ((uint)(byte)(&DAT_001d70d0)[uVar4] - b) +
      ((uint)(byte)(&DAT_001d70d0)[uVar2] - g) * ((uint)(byte)(&DAT_001d70d0)[uVar2] - g) +
      ((uint)(byte)(&DAT_001d70d0)[uVar5] - r) * ((uint)(byte)(&DAT_001d70d0)[uVar5] - r)) {
    iVar1 = iVar1 + 0xe8;
  }
  else {
    iVar1 = uVar2 * 6 + (int)uVar5 * 0x24 + (int)uVar4 + 0x10;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar3 = std::operator<<((ostream *)&oss,"\x1b[38;5;");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  std::operator<<(poVar3,"m");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

static std::string set_xterm256_foreground(int r, int g, int b) {
    int x = rgb2xterm256(r, g, b);
    std::ostringstream oss;
    oss << "\033[38;5;" << x << "m";
    return oss.str();
}